

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

SchemeObject * IsGreaterThanProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  long next;
  long previout;
  SchemeObject *arguments_local;
  
  pSVar2 = Car(arguments);
  pSVar2 = (pSVar2->data).pair.car;
  pSVar3 = Cdr(arguments);
  cVar1 = IsTheEmptyList(pSVar3);
  if (cVar1 == '\0') {
    pSVar3 = Car(pSVar3);
    if ((long)pSVar2 < (long)(pSVar3->data).pair.car) {
      arguments_local = False;
    }
    else {
      arguments_local = True;
    }
  }
  else {
    arguments_local = True;
  }
  return arguments_local;
}

Assistant:

static SchemeObject*
IsGreaterThanProcedure(SchemeObject* arguments) /* (> ...) */
{
    long previout = (Car(arguments))->data.fixnum.value;
    long next;
    while (!IsTheEmptyList(arguments = Cdr(arguments))) {
        next = (Car(arguments))->data.fixnum.value;
        if (previout < next) {
            return False;
        } else {
            return True;
        }
    }
    return True;
}